

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementarySurface::IfcElementarySurface(IfcElementarySurface *this)

{
  *(undefined ***)&this->field_0x48 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x50 = 0;
  *(char **)&this->field_0x58 = "IfcElementarySurface";
  IfcSurface::IfcSurface(&this->super_IfcSurface,&PTR_construction_vtable_24__00771450);
  *(undefined8 *)&(this->super_IfcSurface).field_0x38 = 0;
  *(undefined8 *)&(this->super_IfcSurface).field_0x40 = 0;
  (this->super_IfcSurface).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x771398;
  *(undefined8 *)&this->field_0x48 = 0x771438;
  *(undefined8 *)
   &(this->super_IfcSurface).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7713c0;
  *(undefined8 *)
   &(this->super_IfcSurface).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7713e8;
  *(undefined8 *)&(this->super_IfcSurface).super_IfcGeometricRepresentationItem.field_0x30 =
       0x771410;
  return;
}

Assistant:

IfcElementarySurface() : Object("IfcElementarySurface") {}